

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrLib.cpp
# Opt level: O0

StringBuilder * __thiscall
nv::StringBuilder::appendFormat(StringBuilder *this,char *format,__va_list_tag *arg)

{
  char *s;
  undefined1 local_48 [8];
  StringBuilder tmp_str;
  va_list tmp;
  __va_list_tag *arg_local;
  char *format_local;
  StringBuilder *this_local;
  
  tmp_str.m_str = *(char **)arg;
  StringBuilder((StringBuilder *)local_48);
  StringBuilder::format((StringBuilder *)local_48,format,(__va_list_tag *)&tmp_str.m_str);
  s = operator_cast_to_char_((StringBuilder *)local_48);
  append(this,s);
  ~StringBuilder((StringBuilder *)local_48);
  return this;
}

Assistant:

StringBuilder & StringBuilder::appendFormat( const char * format, va_list arg )
{
	nvDebugCheck( format != NULL );
	
	va_list tmp;
	va_copy(tmp, arg);

	StringBuilder tmp_str;
	tmp_str.format( format, tmp );
	append( tmp_str );
	
	va_end(tmp);

	return *this;
}